

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

void __thiscall pstore::transaction_base::transaction_base(transaction_base *this,database *db)

{
  int iVar1;
  
  this->_vptr_transaction_base = (_func_int **)&PTR__transaction_base_00190568;
  this->db_ = db;
  (this->first_).a_ = 0;
  this->size_ = 0;
  this->dbsize_ = 0;
  iVar1 = (*((db->storage_).file_.
             super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_file_base[4])();
  if ((char)iVar1 != '\0') {
    database::sync(this->db_);
    this->dbsize_ = (db->size_).logical_;
    return;
  }
  raise<pstore::error_code>(transaction_on_read_only_database);
}

Assistant:

transaction_base::transaction_base (database & db)
            : db_{db} {
        if (!db.is_writable ()) {
            raise (error_code::transaction_on_read_only_database);
        }

        // First thing that creating a transaction does is update the view
        // to that of the head revision.
        db_.sync ();
        dbsize_ = db.size ();
    }